

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::Imputer::SharedDtor(Imputer *this)

{
  if (this->_oneof_case_[0] != 0) {
    clear_ImputedValue(this);
  }
  if (this->_oneof_case_[1] != 0) {
    clear_ReplaceValue(this);
    return;
  }
  return;
}

Assistant:

void Imputer::SharedDtor() {
  if (has_ImputedValue()) {
    clear_ImputedValue();
  }
  if (has_ReplaceValue()) {
    clear_ReplaceValue();
  }
}